

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O0

bool tinyusdz::tydra::PrimToPrimSpec(Prim *prim,PrimSpec *ps,string *err)

{
  Model *pMVar1;
  string local_68 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48 [32];
  string *local_28;
  string *err_local;
  PrimSpec *ps_local;
  Prim *prim_local;
  
  local_28 = err;
  err_local = (string *)ps;
  ps_local = (PrimSpec *)prim;
  pMVar1 = Prim::as<tinyusdz::Model>(prim);
  if (pMVar1 == (Model *)0x0) {
    if (local_28 != (string *)0x0) {
      Prim::prim_type_name_abi_cxx11_((Prim *)ps_local);
      ::std::operator+((char *)local_68,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "Unsupported/unimplemented Prim type: ");
      ::std::operator+(local_48,(char *)local_68);
      ::std::__cxx11::string::operator+=((string *)local_28,(string *)local_48);
      ::std::__cxx11::string::~string((string *)local_48);
      ::std::__cxx11::string::~string(local_68);
    }
    prim_local._7_1_ = false;
  }
  else {
    pMVar1 = Prim::as<tinyusdz::Model>((Prim *)ps_local);
    prim_local._7_1_ = PrimToPrimSpecImpl<tinyusdz::Model>(pMVar1,(PrimSpec *)err_local,local_28);
  }
  return prim_local._7_1_;
}

Assistant:

bool PrimToPrimSpec(const Prim &prim, PrimSpec &ps, std::string *err) {
#define TO_PRIMSPEC(__ty)                                   \
  if (prim.as<__ty>()) {                                    \
    return PrimToPrimSpecImpl(*(prim.as<__ty>()), ps, err); \
  } else

  TO_PRIMSPEC(Model) {
    if (err) {
      (*err) +=
          "Unsupported/unimplemented Prim type: " + prim.prim_type_name() +
          "\n";
    }
    return false;
  }

#undef TO_PRIMSPEC
}